

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralConnection::~IfcStructuralConnection
          (IfcStructuralConnection *this,void **vtt)

{
  void **vtt_local;
  IfcStructuralConnection *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>,
             vtt + 0x1f);
  IfcStructuralItem::~IfcStructuralItem((IfcStructuralItem *)this,vtt + 1);
  return;
}

Assistant:

IfcStructuralConnection() : Object("IfcStructuralConnection") {}